

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

void Int_ManPrepareInter(Int_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  uint nWords;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Sto_Cls_t *pSVar9;
  
  if (8 < p->nVarsAB) {
    __assert_fail("p->nVarsAB <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x3c3,"void Int_ManPrepareInter(Int_Man_t *)");
  }
  pSVar9 = (Sto_Cls_t *)&p->pCnf->pHead;
  while ((pSVar9 = pSVar9->pNext, pSVar9 != (Sto_Cls_t *)0x0 &&
         ((*(uint *)&pSVar9->field_0x1c & 2) != 0))) {
    uVar4 = (ulong)(uint)p->nWords;
    puVar3 = p->pInters;
    lVar6 = (long)(pSVar9->Id * p->nWords);
    if ((*(uint *)&pSVar9->field_0x1c & 1) == 0) {
      for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
        puVar3[lVar6 + (uVar4 - 1)] = 0xffffffff;
      }
    }
    else {
      for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
        puVar3[lVar6 + (uVar4 - 1)] = 0;
      }
      for (uVar4 = 0; uVar4 < (*(uint *)&pSVar9->field_0x1c >> 3 & 0xffffff); uVar4 = uVar4 + 1) {
        uVar2 = *(uint *)((long)&pSVar9[1].pNext + uVar4 * 4);
        if (p->pVarTypes[(int)uVar2 >> 1] < 0) {
          uVar5 = ~p->pVarTypes[(int)uVar2 >> 1];
          if (p->nVarsAB <= (int)uVar5) {
            __assert_fail("VarAB >= 0 && VarAB < p->nVarsAB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                          ,0x3d6,"void Int_ManPrepareInter(Int_Man_t *)");
          }
          nWords = p->nWords;
          uVar7 = (ulong)nWords;
          lVar6 = (ulong)uVar5 * 0x20;
          puVar3 = p->pInters;
          lVar8 = (long)(int)(pSVar9->Id * nWords);
          if ((uVar2 & 1) == 0) {
            Int_ManTruthOr(puVar3 + lVar8,(uint *)(&DAT_00817d70 + lVar6),nWords);
          }
          else {
            for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
              puVar1 = puVar3 + lVar8 + (uVar7 - 1);
              *puVar1 = *puVar1 | ~*(uint *)(&UNK_00817d6c + uVar7 * 4 + lVar6);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Int_ManPrepareInter( Int_Man_t * p )
{
    // elementary truth tables
    unsigned uTruths[8][8] = {
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    assert( p->nVarsAB <= 8 );

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Int_ManTruthFill( Int_ManTruthRead(p, pClause), p->nWords );
//            Int_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Int_ManTruthClear( Int_ManTruthRead(p, pClause), p->nWords );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < p->nVarsAB );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Int_ManTruthOrNot( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
                else
                    Int_ManTruthOr( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
            }
        }
//        Int_ManPrintInterOne( p, pClause );
    }
}